

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall BuildStatus::BuildStatus(BuildStatus *this,BuildConfig *config)

{
  int64_t iVar1;
  char *pcVar2;
  BuildConfig *config_local;
  BuildStatus *this_local;
  
  this->config_ = config;
  iVar1 = GetTimeMillis();
  this->start_time_millis_ = iVar1;
  this->started_edges_ = 0;
  this->finished_edges_ = 0;
  this->total_edges_ = 0;
  std::
  map<const_Edge_*,_int,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
  ::map(&this->running_edges_);
  LinePrinter::LinePrinter(&this->printer_);
  this->progress_status_format_ = (char *)0x0;
  RateInfo::RateInfo(&this->overall_rate_);
  SlidingRateInfo::SlidingRateInfo(&this->current_rate_,*(int *)(config + 8));
  if (*(int *)this->config_ != 0) {
    LinePrinter::set_smart_terminal(&this->printer_,false);
  }
  pcVar2 = getenv("NINJA_STATUS");
  this->progress_status_format_ = pcVar2;
  if (this->progress_status_format_ == (char *)0x0) {
    this->progress_status_format_ = "[%f/%t] ";
  }
  return;
}

Assistant:

BuildStatus::BuildStatus(const BuildConfig& config)
    : config_(config), start_time_millis_(GetTimeMillis()), started_edges_(0),
      finished_edges_(0), total_edges_(0), progress_status_format_(NULL),
      current_rate_(config.parallelism) {
  // Don't do anything fancy in verbose mode.
  if (config_.verbosity != BuildConfig::NORMAL)
    printer_.set_smart_terminal(false);

  progress_status_format_ = getenv("NINJA_STATUS");
  if (!progress_status_format_)
    progress_status_format_ = "[%f/%t] ";
}